

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

uchar * __thiscall
anon_unknown.dwarf_170ca6::hex_decoder<unsigned_char_*>::append
          (hex_decoder<unsigned_char_*> *this,uint value)

{
  byte *pbVar1;
  uint value_local;
  hex_decoder<unsigned_char_*> *this_local;
  
  if (value < 0x10) {
    if ((this->is_high_ & 1U) == 0) {
      pbVar1 = this->out_;
      this->out_ = pbVar1 + 1;
      *pbVar1 = *pbVar1 | (byte)value;
    }
    else {
      *this->out_ = (uchar)(value << 4);
    }
    this->is_high_ = (bool)((this->is_high_ ^ 0xffU) & 1);
    return this->out_;
  }
  pstore::assert_failed
            ("value < 16U",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
             ,0x2c);
}

Assistant:

OutputIterator append (unsigned const value) noexcept {
            PSTORE_ASSERT (value < 16U);
            if (is_high_) {
                *out_ = static_cast<std::uint8_t> (value << 4);
            } else {
                *(out_++) |= value;
            }
            is_high_ = !is_high_;
            return out_;
        }